

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_curves.c
# Opt level: O3

int ecp_mod_p384(mbedtls_mpi *N)

{
  ulong *puVar1;
  mbedtls_mpi_uint *pmVar2;
  int iVar3;
  int iVar4;
  byte bVar5;
  uint uVar6;
  uint uVar7;
  byte bVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  char cVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  ulong uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  mbedtls_mpi C;
  mbedtls_mpi_uint Cp [7];
  mbedtls_mpi local_80;
  mbedtls_mpi_uint local_68 [6];
  ulong local_38;
  
  local_80.s = 1;
  local_80.n = 7;
  local_80.p = local_68;
  local_68[0] = 0;
  local_68[1] = 0;
  local_68[2] = 0;
  local_68[3] = 0;
  local_68[4] = 0;
  local_68[5] = 0;
  local_38 = 0;
  iVar3 = mbedtls_mpi_grow(N,0xc);
  if (iVar3 == 0) {
    pmVar2 = N->p;
    uVar10 = pmVar2[6];
    uVar24 = (uint)uVar10;
    uVar7 = (uint)*pmVar2;
    uVar12 = uVar24 + uVar7;
    uVar11 = (uint)(pmVar2[10] >> 0x20);
    uVar13 = uVar12 + uVar11;
    uVar6 = (uint)pmVar2[10];
    uVar14 = uVar13 + uVar6;
    uVar9 = (uint)(pmVar2[0xb] >> 0x20);
    cVar15 = (CARRY4(uVar12,uVar11) + CARRY4(uVar24,uVar7) + CARRY4(uVar13,uVar6)) -
             (uVar14 < uVar9);
    uVar12 = (uint)cVar15;
    uVar13 = (uint)(*pmVar2 >> 0x20);
    if (cVar15 < '\0') {
      cVar15 = -(uVar13 < -uVar12);
    }
    else {
      cVar15 = CARRY4(uVar12,uVar13);
    }
    uVar23 = (uint)(uVar10 >> 0x20);
    uVar16 = uVar12 + uVar13 + uVar23;
    uVar7 = (uint)pmVar2[0xb];
    uVar17 = uVar16 + uVar7;
    uVar18 = uVar17 + uVar9;
    uVar19 = uVar18 - uVar24;
    cVar15 = ((CARRY4(uVar16,uVar7) + cVar15 + CARRY4(uVar12 + uVar13,uVar23) + CARRY4(uVar17,uVar9)
              ) - (uVar18 < uVar24)) - (uVar19 < uVar6);
    *pmVar2 = CONCAT44(uVar19 - uVar6,uVar14 - uVar9);
    uVar13 = (uint)cVar15;
    uVar12 = (uint)pmVar2[1];
    if (cVar15 < '\0') {
      cVar15 = -(uVar12 < -uVar13);
    }
    else {
      cVar15 = CARRY4(uVar13,uVar12);
    }
    uVar14 = (uint)pmVar2[7];
    uVar16 = uVar13 + uVar12 + uVar14;
    uVar17 = uVar16 + uVar9;
    uVar18 = uVar17 - uVar23;
    cVar15 = ((CARRY4(uVar13 + uVar12,uVar14) + cVar15 + CARRY4(uVar16,uVar9)) - (uVar17 < uVar23))
             - (uVar18 < uVar11);
    uVar13 = (uint)cVar15;
    uVar12 = (uint)(pmVar2[1] >> 0x20);
    if (cVar15 < '\0') {
      cVar15 = -(uVar12 < -uVar13);
    }
    else {
      cVar15 = CARRY4(uVar13,uVar12);
    }
    uVar16 = (uint)(pmVar2[7] >> 0x20);
    uVar17 = uVar13 + uVar12 + uVar16;
    uVar19 = uVar17 + uVar24;
    uVar26 = uVar19 + uVar6;
    uVar27 = uVar26 + uVar11;
    uVar28 = uVar27 - uVar14;
    uVar29 = uVar28 - uVar7;
    cVar15 = (((CARRY4(uVar19,uVar6) +
                CARRY4(uVar13 + uVar12,uVar16) + cVar15 + CARRY4(uVar17,uVar24) +
               CARRY4(uVar26,uVar11)) - (uVar27 < uVar14)) - (uVar28 < uVar7)) - (uVar29 < uVar9);
    pmVar2[1] = CONCAT44(uVar29 - uVar9,uVar18 - uVar11);
    uVar12 = (uint)cVar15;
    uVar13 = (uint)pmVar2[2];
    if (cVar15 < '\0') {
      cVar15 = -(uVar13 < -uVar12);
    }
    else {
      cVar15 = CARRY4(uVar12,uVar13);
    }
    uVar17 = uVar12 + uVar13 + uVar11;
    uVar18 = uVar17 + uVar11;
    uVar25 = (uint)pmVar2[8];
    uVar19 = uVar18 + uVar25;
    uVar26 = uVar19 + uVar23;
    uVar27 = uVar26 + uVar24;
    uVar28 = uVar27 + uVar6;
    uVar29 = uVar28 + uVar7;
    uVar21 = uVar29 - uVar16;
    uVar22 = uVar21 - uVar9;
    cVar15 = (((CARRY4(uVar27,uVar6) +
                CARRY4(uVar19,uVar23) +
                CARRY4(uVar17,uVar11) + cVar15 + CARRY4(uVar12 + uVar13,uVar11) +
                CARRY4(uVar18,uVar25) + CARRY4(uVar26,uVar24) + CARRY4(uVar28,uVar7)) -
              (uVar29 < uVar16)) - (uVar21 < uVar9)) - (uVar22 < uVar9);
    uVar12 = (uint)cVar15;
    uVar13 = (uint)(pmVar2[2] >> 0x20);
    if (cVar15 < '\0') {
      cVar15 = -(uVar13 < -uVar12);
    }
    else {
      cVar15 = CARRY4(uVar12,uVar13);
    }
    uVar24 = uVar12 + uVar13 + uVar7;
    uVar17 = uVar24 + uVar7;
    uVar29 = (uint)(pmVar2[8] >> 0x20);
    uVar18 = uVar17 + uVar29;
    uVar19 = uVar18 + uVar14;
    uVar26 = uVar19 + uVar23;
    uVar27 = uVar26 + uVar11;
    uVar28 = uVar27 + uVar9;
    cVar15 = (CARRY4(uVar26,uVar11) +
              CARRY4(uVar18,uVar14) +
              CARRY4(uVar24,uVar7) + cVar15 + CARRY4(uVar12 + uVar13,uVar7) + CARRY4(uVar17,uVar29)
              + CARRY4(uVar19,uVar23) + CARRY4(uVar27,uVar9)) - (uVar28 < uVar25);
    pmVar2[2] = CONCAT44(uVar28 - uVar25,uVar22 - uVar9);
    uVar12 = (uint)cVar15;
    uVar13 = (uint)pmVar2[3];
    if (cVar15 < '\0') {
      cVar15 = -(uVar13 < -uVar12);
    }
    else {
      cVar15 = CARRY4(uVar12,uVar13);
    }
    uVar17 = uVar12 + uVar13 + uVar9;
    uVar18 = uVar17 + uVar9;
    uVar24 = (uint)pmVar2[9];
    uVar19 = uVar18 + uVar24;
    uVar23 = uVar19 + uVar16;
    uVar26 = uVar23 + uVar14;
    uVar27 = uVar26 + uVar7;
    cVar15 = (CARRY4(uVar23,uVar14) +
              CARRY4(uVar18,uVar24) + CARRY4(uVar12 + uVar13,uVar9) + cVar15 + CARRY4(uVar17,uVar9)
              + CARRY4(uVar19,uVar16) + CARRY4(uVar26,uVar7)) - (uVar27 < uVar29);
    uVar12 = (uint)cVar15;
    uVar13 = (uint)(pmVar2[3] >> 0x20);
    if (cVar15 < '\0') {
      cVar15 = -(uVar13 < -uVar12);
    }
    else {
      cVar15 = CARRY4(uVar12,uVar13);
    }
    uVar23 = (uint)(pmVar2[9] >> 0x20);
    uVar14 = uVar12 + uVar13 + uVar23;
    uVar17 = uVar14 + uVar25;
    uVar18 = uVar17 + uVar16;
    uVar19 = uVar18 + uVar9;
    cVar15 = (CARRY4(uVar17,uVar16) +
              CARRY4(uVar12 + uVar13,uVar23) + cVar15 + CARRY4(uVar14,uVar25) + CARRY4(uVar18,uVar9)
             ) - (uVar19 < uVar24);
    pmVar2[3] = CONCAT44(uVar19 - uVar24,uVar27 - uVar29);
    uVar12 = (uint)cVar15;
    uVar13 = (uint)pmVar2[4];
    if (cVar15 < '\0') {
      cVar15 = -(uVar13 < -uVar12);
    }
    else {
      cVar15 = CARRY4(uVar12,uVar13);
    }
    uVar14 = uVar12 + uVar13 + uVar6;
    uVar16 = uVar14 + uVar29;
    uVar17 = uVar16 + uVar25;
    cVar15 = (CARRY4(uVar14,uVar29) + cVar15 + CARRY4(uVar12 + uVar13,uVar6) + CARRY4(uVar16,uVar25)
             ) - (uVar17 < uVar23);
    uVar13 = (uint)cVar15;
    uVar12 = (uint)(pmVar2[4] >> 0x20);
    if (cVar15 < '\0') {
      cVar15 = -(uVar12 < -uVar13);
    }
    else {
      cVar15 = CARRY4(uVar13,uVar12);
    }
    uVar14 = uVar13 + uVar12 + uVar11;
    uVar16 = uVar14 + uVar24;
    uVar18 = uVar16 + uVar29;
    cVar15 = (CARRY4(uVar14,uVar24) + cVar15 + CARRY4(uVar13 + uVar12,uVar11) +
             CARRY4(uVar16,uVar29)) - (uVar18 < uVar6);
    pmVar2[4] = CONCAT44(uVar18 - uVar6,uVar17 - uVar23);
    uVar12 = (uint)cVar15;
    uVar13 = (uint)pmVar2[5];
    if (cVar15 < '\0') {
      cVar15 = -(uVar13 < -uVar12);
    }
    else {
      cVar15 = CARRY4(uVar12,uVar13);
    }
    uVar14 = uVar12 + uVar13 + uVar7;
    uVar16 = uVar14 + uVar23;
    uVar17 = uVar16 + uVar24;
    cVar15 = (CARRY4(uVar14,uVar23) + cVar15 + CARRY4(uVar12 + uVar13,uVar7) + CARRY4(uVar16,uVar24)
             ) - (uVar17 < uVar11);
    uVar12 = (uint)cVar15;
    uVar13 = (uint)(pmVar2[5] >> 0x20);
    if (cVar15 < '\0') {
      cVar15 = -(uVar13 < -uVar12);
    }
    else {
      cVar15 = CARRY4(uVar12,uVar13);
    }
    uVar14 = uVar12 + uVar13 + uVar9;
    uVar24 = uVar14 + uVar6;
    uVar16 = uVar24 + uVar23;
    bVar5 = (CARRY4(uVar14,uVar6) + cVar15 + CARRY4(uVar12 + uVar13,uVar9) + CARRY4(uVar24,uVar23))
            - (uVar16 < uVar7);
    bVar8 = 0;
    if ('\0' < (char)bVar5) {
      bVar8 = bVar5;
    }
    pmVar2[5] = CONCAT44(uVar16 - uVar7,uVar17 - uVar11);
    pmVar2[6] = (ulong)bVar8 | uVar10 & 0xffffffff00000000;
    if (0xd < N->n * 2) {
      uVar10 = 0xc;
      do {
        uVar20 = 0xffffffff00000000;
        if ((uVar10 & 1) == 0) {
          uVar20 = 0xffffffff;
        }
        puVar1 = (ulong *)((long)pmVar2 + (uVar10 + 1 & 0xfffffffffffffffe) * 4);
        *puVar1 = *puVar1 & uVar20;
        uVar20 = uVar10 + 2;
        uVar10 = uVar10 + 1;
      } while (uVar20 < N->n * 2);
    }
    if ((char)bVar5 < '\0') {
      local_38 = (ulong)(byte)-bVar5;
      iVar4 = mbedtls_mpi_sub_abs(N,&local_80,N);
      if (iVar4 == 0) {
        N->s = -1;
      }
    }
  }
  return iVar3;
}

Assistant:

static int ecp_mod_p384( mbedtls_mpi *N )
{
    INIT( 384 );

    ADD( 12 ); ADD( 21 ); ADD( 20 );
    SUB( 23 );                                              NEXT; // A0

    ADD( 13 ); ADD( 22 ); ADD( 23 );
    SUB( 12 ); SUB( 20 );                                   NEXT; // A2

    ADD( 14 ); ADD( 23 );
    SUB( 13 ); SUB( 21 );                                   NEXT; // A2

    ADD( 15 ); ADD( 12 ); ADD( 20 ); ADD( 21 );
    SUB( 14 ); SUB( 22 ); SUB( 23 );                        NEXT; // A3

    ADD( 21 ); ADD( 21 ); ADD( 16 ); ADD( 13 ); ADD( 12 ); ADD( 20 ); ADD( 22 );
    SUB( 15 ); SUB( 23 ); SUB( 23 );                        NEXT; // A4

    ADD( 22 ); ADD( 22 ); ADD( 17 ); ADD( 14 ); ADD( 13 ); ADD( 21 ); ADD( 23 );
    SUB( 16 );                                              NEXT; // A5

    ADD( 23 ); ADD( 23 ); ADD( 18 ); ADD( 15 ); ADD( 14 ); ADD( 22 );
    SUB( 17 );                                              NEXT; // A6

    ADD( 19 ); ADD( 16 ); ADD( 15 ); ADD( 23 );
    SUB( 18 );                                              NEXT; // A7

    ADD( 20 ); ADD( 17 ); ADD( 16 );
    SUB( 19 );                                              NEXT; // A8

    ADD( 21 ); ADD( 18 ); ADD( 17 );
    SUB( 20 );                                              NEXT; // A9

    ADD( 22 ); ADD( 19 ); ADD( 18 );
    SUB( 21 );                                              NEXT; // A10

    ADD( 23 ); ADD( 20 ); ADD( 19 );
    SUB( 22 );                                              LAST; // A11

cleanup:
    return( ret );
}